

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O0

int CfdGetTxCountInBlock(void *handle,void *block_handle,uint32_t *tx_count)

{
  uint32_t uVar1;
  undefined8 uVar2;
  string *message;
  uint32_t *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  CfdCapiBlockData *block_data;
  int result;
  string *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  CfdError error_code;
  allocator *paVar3;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  allocator local_f1;
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  allocator local_59;
  string *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa8,"BlockOpe",&local_59);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (in_RDX == (uint32_t *)0x0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_block.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 400;
    local_80.funcname = "CfdGetTxCountInBlock";
    cfd::core::logger::warn<>(&local_80,"tx_count is null.");
    local_a2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Failed to parameter. tx_count is null.",&local_a1);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               error_code,in_stack_fffffffffffffeb0);
    local_a2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(in_RSI + 0x18) == 0) {
    local_ca = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Invalid handle state. block is null",&local_c9);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               error_code,in_stack_fffffffffffffeb0);
    local_ca = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(int *)(in_RSI + 0x10) < 3) {
    uVar1 = cfd::core::Block::GetTransactionCount(*(Block **)(in_RSI + 0x18));
    *in_RDX = uVar1;
    return 0;
  }
  message = (string *)__cxa_allocate_exception(0x30);
  paVar3 = &local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"Elements is not supported.",paVar3);
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (CfdError)((ulong)paVar3 >> 0x20),message);
  __cxa_throw(message,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxCountInBlock(
    void* handle, void* block_handle, uint32_t* tx_count) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(block_handle, kPrefixBlock);
    CfdCapiBlockData* block_data =
        static_cast<CfdCapiBlockData*>(block_handle);
    if (tx_count == nullptr) {
      warn(CFD_LOG_SOURCE, "tx_count is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx_count is null.");
    }

    if (block_data->block == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. block is null");
    } else if (block_data->net_type <= NetType::kRegtest) {
      *tx_count = block_data->block->GetTransactionCount();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}